

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isFBOStatusValid(ValidStatusCodes *this,GLenum fboStatus)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_20;
  int ndx;
  GLenum fboStatus_local;
  ValidStatusCodes *this_local;
  
  if (fboStatus == 0x8cd5) {
    this_local._7_1_ = (bool)(this->m_allowComplete & 1);
  }
  else {
    for (local_20 = 0;
        sVar1 = std::
                vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                ::size(&this->m_errorStatuses), local_20 < (int)sVar1; local_20 = local_20 + 1) {
      pvVar2 = std::
               vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ::operator[](&this->m_errorStatuses,(long)local_20);
      if (pvVar2->errorCode == fboStatus) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidStatusCodes::isFBOStatusValid (glw::GLenum fboStatus) const
{
	if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
		return m_allowComplete;
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		{
			if (m_errorStatuses[ndx].errorCode == fboStatus)
				return true;
		}
		return false;
	}
}